

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_biquad_process_pcm_frames
                    (ma_biquad *pBQ,void *pFramesOut,void *pFramesIn,ma_uint64 frameCount)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ma_biquad_coefficient *pmVar15;
  ma_result mVar16;
  int iVar17;
  undefined2 uVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  float fVar24;
  
  mVar16 = MA_INVALID_ARGS;
  if (pFramesIn != (void *)0x0 && (pFramesOut != (void *)0x0 && pBQ != (ma_biquad *)0x0)) {
    if (pBQ->format == ma_format_f32) {
      for (uVar20 = 0; uVar20 < frameCount; uVar20 = (ulong)((int)uVar20 + 1)) {
        uVar8 = pBQ->channels;
        fVar1 = (pBQ->b0).f32;
        fVar2 = (pBQ->b1).f32;
        fVar3 = (pBQ->b2).f32;
        fVar4 = (pBQ->a1).f32;
        fVar5 = (pBQ->a2).f32;
        for (uVar23 = 0; uVar8 != uVar23; uVar23 = uVar23 + 1) {
          pmVar15 = pBQ->pR1;
          fVar6 = *(float *)((long)pFramesIn + uVar23 * 4);
          fVar24 = fVar1 * fVar6 + pmVar15[uVar23].f32;
          fVar7 = pBQ->pR2[uVar23].f32;
          *(float *)((long)pFramesOut + uVar23 * 4) = fVar24;
          pmVar15[uVar23].f32 = fVar2 * fVar6 + fVar24 * -fVar4 + fVar7;
          pBQ->pR2[uVar23].f32 = fVar6 * fVar3 + fVar24 * -fVar5;
        }
        pFramesOut = (void *)((long)pFramesOut + (ulong)pBQ->channels * 4);
        pFramesIn = (void *)((long)pFramesIn + (ulong)pBQ->channels * 4);
      }
    }
    else {
      if (pBQ->format != ma_format_s16) {
        return MA_INVALID_ARGS;
      }
      for (uVar20 = 0; uVar20 < frameCount; uVar20 = (ulong)((int)uVar20 + 1)) {
        uVar8 = pBQ->channels;
        iVar9 = (pBQ->b0).s32;
        iVar10 = (pBQ->b1).s32;
        iVar11 = (pBQ->b2).s32;
        iVar12 = (pBQ->a1).s32;
        iVar13 = (pBQ->a2).s32;
        for (uVar23 = 0; uVar8 != uVar23; uVar23 = uVar23 + 1) {
          pmVar15 = pBQ->pR1;
          iVar17 = (int)*(short *)((long)pFramesIn + uVar23 * 2);
          iVar19 = iVar9 * iVar17 + pmVar15[uVar23].s32 >> 0xe;
          iVar14 = pBQ->pR2[uVar23].s32;
          iVar21 = iVar12 * iVar19;
          iVar22 = iVar19 * iVar13;
          if (0x7ffe < iVar19) {
            iVar19 = 0x7fff;
          }
          uVar18 = (undefined2)iVar19;
          if (iVar19 < -0x7fff) {
            uVar18 = 0x8000;
          }
          *(undefined2 *)((long)pFramesOut + uVar23 * 2) = uVar18;
          pmVar15[uVar23].s32 = (iVar10 * iVar17 + iVar14) - iVar21;
          pBQ->pR2[uVar23].s32 = iVar17 * iVar11 - iVar22;
        }
        pFramesOut = (void *)((long)pFramesOut + (ulong)pBQ->channels * 2);
        pFramesIn = (void *)((long)pFramesIn + (ulong)pBQ->channels * 2);
      }
    }
    mVar16 = MA_SUCCESS;
  }
  return mVar16;
}

Assistant:

MA_API ma_result ma_biquad_process_pcm_frames(ma_biquad* pBQ, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    ma_uint32 n;

    if (pBQ == NULL || pFramesOut == NULL || pFramesIn == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Note that the logic below needs to support in-place filtering. That is, it must support the case where pFramesOut and pFramesIn are the same. */

    if (pBQ->format == ma_format_f32) {
        /* */ float* pY = (      float*)pFramesOut;
        const float* pX = (const float*)pFramesIn;

        for (n = 0; n < frameCount; n += 1) {
            ma_biquad_process_pcm_frame_f32__direct_form_2_transposed(pBQ, pY, pX);
            pY += pBQ->channels;
            pX += pBQ->channels;
        }
    } else if (pBQ->format == ma_format_s16) {
        /* */ ma_int16* pY = (      ma_int16*)pFramesOut;
        const ma_int16* pX = (const ma_int16*)pFramesIn;

        for (n = 0; n < frameCount; n += 1) {
            ma_biquad_process_pcm_frame_s16__direct_form_2_transposed(pBQ, pY, pX);
            pY += pBQ->channels;
            pX += pBQ->channels;
        }
    } else {
        MA_ASSERT(MA_FALSE);
        return MA_INVALID_ARGS; /* Format not supported. Should never hit this because it's checked in ma_biquad_init() and ma_biquad_reinit(). */
    }

    return MA_SUCCESS;
}